

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moderation.cpp
# Opt level: O1

void Commands::Ban(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *arguments,Command_Source *from,bool announce)

{
  pointer pbVar1;
  pointer pcVar2;
  int iVar3;
  undefined4 extraout_var;
  Character *victim;
  undefined4 extraout_var_00;
  mapped_type *this;
  double dVar4;
  string local_c0;
  double local_a0;
  key_type local_98;
  string local_78;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  iVar3 = (*from->_vptr_Command_Source[4])(from);
  pbVar1 = (arguments->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (pbVar1->_M_dataplus)._M_p;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar2,pcVar2 + pbVar1->_M_string_length);
  victim = World::GetCharacter((World *)CONCAT44(extraout_var,iVar3),&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  pbVar1 = (arguments->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(arguments->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    iVar3 = (*from->_vptr_Command_Source[4])(from);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"DefaultBanLength","");
    this = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)(CONCAT44(extraout_var_00,iVar3) + 0x198),&local_98);
    util::variant::GetString_abi_cxx11_(&local_c0,this);
    local_a0 = util::tdparse(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    local_58._0_4_ = (undefined4)local_a0;
  }
  else {
    util::lowercase(&local_c0,pbVar1 + 1);
    iVar3 = std::__cxx11::string::compare((char *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if (iVar3 == 0) {
      local_58._0_4_ = 0xffffffff;
    }
    else {
      dVar4 = util::tdparse((arguments->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1);
      local_58._0_4_ = (undefined4)dVar4;
    }
  }
  local_58._8_8_ = 0;
  local_58._4_4_ = 0;
  pcStack_40 = std::
               _Function_handler<void_(World_*,_Command_Source_*,_Character_*,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/commands/moderation.cpp:65:30)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(World_*,_Command_Source_*,_Character_*,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/commands/moderation.cpp:65:30)>
             ::_M_manager;
  do_punishment(from,victim,
                (function<void_(World_*,_Command_Source_*,_Character_*,_bool)> *)&local_58,announce)
  ;
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return;
}

Assistant:

void Ban(const std::vector<std::string>& arguments, Command_Source* from, bool announce = true)
{
	Character* victim = from->SourceWorld()->GetCharacter(arguments[0]);
	int duration = -1;

	if (arguments.size() >= 2)
	{
		if (util::lowercase(arguments[1]) != "forever")
			duration = int(util::tdparse(arguments[1]));
	}
	else
	{
		duration = int(util::tdparse(from->SourceWorld()->config["DefaultBanLength"]));
	}

	do_punishment(from, victim, [duration](World* world, Command_Source* from, Character* victim, bool announce)
		{
			world->Ban(from, victim, duration, announce);
		}, announce);
}